

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL12_compat.c
# Opt level: O3

int SDL_CDResume(SDL12_CD *cdrom)

{
  int iVar1;
  SDL12_CDstatus SVar2;
  undefined8 in_RDX;
  undefined8 in_RSI;
  char *pcVar3;
  
  if (CDRomInit == '\x01') {
    if ((cdrom != (SDL12_CD *)0x0) || (cdrom = CDRomDevice, CDRomDevice != (SDL12_CD *)0x0)) {
      if (cdrom->status != SDL12_CD_TRAYEMPTY) {
        (*SDL20_LockAudio)();
        if (audio_cbdata != (AudioCallbackWrapperData *)0x0) {
          SVar2 = audio_cbdata->cdrom_status;
          if (SVar2 == SDL12_CD_PAUSED) {
            audio_cbdata->cdrom_status = SDL12_CD_PLAYING;
            SVar2 = SDL12_CD_PLAYING;
          }
          cdrom->status = SVar2;
        }
        (*SDL20_UnlockAudio)();
        return 0;
      }
      iVar1 = (*SDL20_SetError)("Tray empty",in_RSI,in_RDX,SDL20_SetError);
      return iVar1;
    }
    pcVar3 = "CD-ROM not opened";
  }
  else {
    pcVar3 = "CD-ROM subsystem not initialized";
  }
  (*SDL20_SetError)(pcVar3);
  return -1;
}

Assistant:

SDLCALL
SDL_CDResume(SDL12_CD *cdrom)
{
    if ((cdrom = ValidCDDevice(cdrom)) == NULL) {
        return -1;
    }
    if (cdrom->status == SDL12_CD_TRAYEMPTY) {
        return SDL20_SetError("Tray empty");
    }

    SDL20_LockAudio();
    if (audio_cbdata) {
        if (audio_cbdata->cdrom_status == SDL12_CD_PAUSED) {
            audio_cbdata->cdrom_status = SDL12_CD_PLAYING;
        }
        cdrom->status = audio_cbdata->cdrom_status;
    }
    SDL20_UnlockAudio();
    return 0;
}